

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O3

XMLCh * __thiscall
xercesc_4_0::DOMNodeImpl::getTextContent
          (DOMNodeImpl *this,XMLCh *pzBuffer,XMLSize_t *rnBufferLength)

{
  short *psVar1;
  DOMNode *pDVar2;
  uint uVar3;
  int iVar4;
  ulong in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar5;
  long lVar6;
  DOMNodeImpl *pDVar7;
  long *plVar8;
  DOMException *this_00;
  ulong uVar9;
  ulong maxChars;
  XMLSize_t nContentLength;
  XMLSize_t local_38;
  XMLCh *src;
  
  uVar9 = *rnBufferLength;
  *rnBufferLength = 0;
  if (pzBuffer != (XMLCh *)0x0) {
    *pzBuffer = L'\0';
  }
  pDVar2 = this->fContainingNode;
  local_38 = in_RAX;
  uVar3 = (*pDVar2->_vptr_DOMNode[4])(pDVar2);
  if (uVar3 < 0xc) {
    if ((0x19cU >> (uVar3 & 0x1f) & 1) == 0) {
      if ((0x862U >> (uVar3 & 0x1f) & 1) != 0) {
        iVar4 = (*pDVar2->_vptr_DOMNode[7])(pDVar2);
        for (plVar8 = (long *)CONCAT44(extraout_var_00,iVar4); plVar8 != (long *)0x0;
            plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8)) {
          iVar4 = (**(code **)(*plVar8 + 0x20))(plVar8);
          if ((iVar4 != 8) && (iVar4 = (**(code **)(*plVar8 + 0x20))(plVar8), iVar4 != 7)) {
            if (pzBuffer == (XMLCh *)0x0) {
              local_38 = 0;
              plVar5 = (long *)__dynamic_cast(plVar8,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                              0xfffffffffffffffe);
              if ((plVar5 == (long *)0x0) ||
                 (lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5), lVar6 == 0)) {
                this_00 = (DOMException *)__cxa_allocate_exception(0x28);
                DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
                goto LAB_0027311d;
              }
              pDVar7 = (DOMNodeImpl *)(**(code **)(*plVar5 + 0x10))(plVar5);
              getTextContent(pDVar7,(XMLCh *)0x0,&local_38);
              *rnBufferLength = *rnBufferLength + local_38;
            }
            else {
              local_38 = uVar9;
              plVar5 = (long *)__dynamic_cast(plVar8,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                              0xfffffffffffffffe);
              if ((plVar5 == (long *)0x0) ||
                 (lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5), lVar6 == 0)) {
                this_00 = (DOMException *)__cxa_allocate_exception(0x28);
                DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
LAB_0027311d:
                __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
              }
              pDVar7 = (DOMNodeImpl *)(**(code **)(*plVar5 + 0x10))(plVar5);
              getTextContent(pDVar7,pzBuffer + *rnBufferLength,&local_38);
              *rnBufferLength = *rnBufferLength + local_38;
              uVar9 = uVar9 - local_38;
            }
          }
        }
      }
    }
    else {
      iVar4 = (*pDVar2->_vptr_DOMNode[3])(pDVar2);
      src = (XMLCh *)CONCAT44(extraout_var,iVar4);
      maxChars = 0;
      if (src != (XMLCh *)0x0) {
        do {
          psVar1 = (short *)((long)src + maxChars);
          maxChars = maxChars + 2;
        } while (*psVar1 != 0);
        maxChars = ((long)maxChars >> 1) - 1;
      }
      if (pzBuffer != (XMLCh *)0x0) {
        if (uVar9 < maxChars) {
          maxChars = uVar9;
        }
        XMLString::copyNString(pzBuffer + *rnBufferLength,src,maxChars);
      }
      *rnBufferLength = *rnBufferLength + maxChars;
    }
  }
  return pzBuffer;
}

Assistant:

const XMLCh*    DOMNodeImpl::getTextContent(XMLCh* pzBuffer, XMLSize_t& rnBufferLength) const
{
	XMLSize_t nRemainingBuffer = rnBufferLength;
	rnBufferLength = 0;

	if (pzBuffer)
		*pzBuffer = 0;

	const DOMNode *thisNode = getContainingNode();

	switch (thisNode->getNodeType())
	{
	case DOMNode::ELEMENT_NODE:
    case DOMNode::ENTITY_NODE:
    case DOMNode::ENTITY_REFERENCE_NODE:
    case DOMNode::DOCUMENT_FRAGMENT_NODE:
    {
		DOMNode* current = thisNode->getFirstChild();

		while (current != NULL)
		{
			if (current->getNodeType() != DOMNode::COMMENT_NODE &&
				current->getNodeType() != DOMNode::PROCESSING_INSTRUCTION_NODE)
			{

				if (pzBuffer)
				{
					XMLSize_t nContentLength = nRemainingBuffer;
					castToNodeImpl(current)->getTextContent(pzBuffer + rnBufferLength, nContentLength);
					rnBufferLength += nContentLength;
					nRemainingBuffer -= nContentLength;
				}
				else
				{
					XMLSize_t nContentLength = 0;
					castToNodeImpl(current)->getTextContent(NULL, nContentLength);
					rnBufferLength += nContentLength;
				}
			}

			current = current->getNextSibling();

		}
    }

    break;

    case DOMNode::ATTRIBUTE_NODE:
    case DOMNode::TEXT_NODE:
    case DOMNode::CDATA_SECTION_NODE:
    case DOMNode::COMMENT_NODE:
    case DOMNode::PROCESSING_INSTRUCTION_NODE:
    {
		const XMLCh* pzValue = thisNode->getNodeValue();
		XMLSize_t nStrLen = XMLString::stringLen(pzValue);

		if (pzBuffer)
		{
			XMLSize_t nContentLength = (nRemainingBuffer >= nStrLen) ? nStrLen : nRemainingBuffer;
			XMLString::copyNString(pzBuffer + rnBufferLength, pzValue, nContentLength);
			rnBufferLength += nContentLength;
			nRemainingBuffer -= nContentLength;
		}
		else
		{
			rnBufferLength += nStrLen;
		}

    }

    break;

	/***
         DOCUMENT_NODE
		 DOCUMENT_TYPE_NODE
		 NOTATION_NODE
	***/
	default:

		break;
	}

	return pzBuffer;

}